

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

void __thiscall duckdb::DuckDB::LoadStaticExtension<duckdb::ParquetExtension>(DuckDB *this)

{
  bool bVar1;
  DatabaseInstance *this_00;
  ParquetExtension extension;
  Extension local_c8;
  string local_c0;
  undefined1 local_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_c8._vptr_Extension = (_func_int **)&PTR__Extension_027d2468;
  ParquetExtension::Name_abi_cxx11_((string *)local_a0,(ParquetExtension *)&local_c8);
  bVar1 = ExtensionIsLoaded(this,(string *)local_a0);
  ::std::__cxx11::string::~string((string *)local_a0);
  if (!bVar1) {
    ParquetExtension::Load((ParquetExtension *)&local_c8,this);
    local_a0._8_8_ = &local_88;
    local_a0._16_8_ = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_38._M_p = (pointer)&local_28;
    local_30 = 0;
    local_28._M_local_buf[0] = '\0';
    local_a0[0] = (string)0x3;
    ParquetExtension::Version_abi_cxx11_(&local_c0,(ParquetExtension *)&local_c8);
    ::std::__cxx11::string::operator=((string *)&local_58,(string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    this_00 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->instance);
    ParquetExtension::Name_abi_cxx11_(&local_c0,(ParquetExtension *)&local_c8);
    DatabaseInstance::SetExtensionLoaded(this_00,&local_c0,(ExtensionInstallInfo *)local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ExtensionInstallInfo::~ExtensionInstallInfo((ExtensionInstallInfo *)local_a0);
  }
  Extension::~Extension(&local_c8);
  return;
}

Assistant:

void LoadStaticExtension() {
		T extension;
		if (ExtensionIsLoaded(extension.Name())) {
			return;
		}
		extension.Load(*this);
		ExtensionInstallInfo install_info;
		install_info.mode = ExtensionInstallMode::STATICALLY_LINKED;
		install_info.version = extension.Version();
		instance->SetExtensionLoaded(extension.Name(), install_info);
	}